

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
CMeshClosestPointMapper::AdaptedMatchFaceTC
          (CMeshClosestPointMapper *this,int count,ON_3dPoint *pPts,SamplePoint *pSamplePts,
          int tcCount,ON_3dPoint *pTcsOut,double mappingTol,bool bEqualFaceCheck,
          TcSeamlessPatchCache *patchCache)

{
  ON_SimpleArray<int> *src;
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  ON_Mesh *this_00;
  undefined8 uVar4;
  ON_3dVector delta;
  bool bVar5;
  bool bVar6;
  int iVar7;
  TcSeamlessPatch *pTVar8;
  int *piVar9;
  ON_MeshFace *this_01;
  ON_3dPoint *pOVar10;
  bool bVar11;
  long lVar12;
  _func_int **pp_Var13;
  int pti;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  ON_SimpleArray<int> commonFis;
  ON_SimpleArray<int> newCommonFis;
  ON_SimpleArray<int> allFis;
  ON_RTreeSphere sphere;
  ON_3dPointArray bestTcs;
  ON_BoundingBox samplePointBbox;
  double local_188;
  ON_SimpleArray<int> local_160;
  CMeshClosestPointMapper *local_148;
  _func_int **local_140;
  undefined1 local_138 [16];
  double local_128;
  uint local_11c;
  ON_SimpleArray<int> local_118;
  double local_100;
  SamplePoint *local_f8;
  ON_3dPoint *local_f0;
  ON_BoundingBox local_e8;
  ON_SimpleArray<ON_3dPoint> local_b0;
  int local_98 [4];
  long local_88;
  ON_2fPointArray *local_80;
  ON_3dVector local_78;
  ON_BoundingBox local_60;
  
  local_f8 = pSamplePts;
  local_f0 = pPts;
  ON_BoundingBox::ON_BoundingBox(&local_60);
  local_160._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  local_160.m_a = (int *)0x0;
  local_160.m_count = 0;
  local_160.m_capacity = 0;
  local_140 = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  local_118._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008176a8;
  local_118.m_a = (int *)0x0;
  local_118.m_count = 0;
  local_118.m_capacity = 0;
  local_148 = this;
  if (0 < count) {
    src = &this->m_resFis;
    uVar16 = 0;
    do {
      pOVar10 = local_f0 + uVar16;
      ON_BoundingBox::Set(&local_60,pOVar10,1);
      local_e8.m_min.x = pOVar10->x;
      local_e8.m_min.y = pOVar10->y;
      local_e8.m_min.z = pOVar10->z;
      if (-1 < (this->m_resFis).m_capacity) {
        (this->m_resFis).m_count = 0;
      }
      local_e8.m_max.x = mappingTol;
      ON_RTree::Search(this->m_pMeshFaceTree,(ON_RTreeSphere *)&local_e8,RTreeCallback,this);
      if (uVar16 == 0) {
        ON_SimpleArray<int>::operator=(&local_160,src);
      }
      else {
        local_138._0_8_ = local_140;
        local_138._8_8_ = (int *)0x0;
        local_128 = 0.0;
        if ((long)local_160.m_count != 0) {
          ON_SimpleArray<int>::SetCapacity((ON_SimpleArray<int> *)local_138,(long)local_160.m_count)
          ;
        }
        if (0 < local_160.m_count) {
          lVar14 = 0;
          lVar12 = 0;
          do {
            iVar7 = ON_SimpleArray<int>::Search(src,(int *)((long)local_160.m_a + lVar14));
            if (-1 < iVar7) {
              ON_SimpleArray<int>::Append
                        ((ON_SimpleArray<int> *)local_138,(int *)((long)local_160.m_a + lVar14));
            }
            lVar12 = lVar12 + 1;
            lVar14 = lVar14 + 4;
          } while (lVar12 < local_160.m_count);
        }
        ON_SimpleArray<int>::operator=(&local_160,(ON_SimpleArray<int> *)local_138);
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_138);
        this = local_148;
      }
      if (0 < (this->m_resFis).m_count) {
        lVar12 = 0;
        do {
          iVar7 = (this->m_resFis).m_a[lVar12];
          local_138._0_4_ = iVar7;
          lVar14 = (long)local_118.m_count;
          piVar9 = local_118.m_a;
          if (0 < lVar14) {
            do {
              if (iVar7 == *piVar9) goto LAB_004eb769;
              lVar14 = lVar14 + -1;
              piVar9 = piVar9 + 1;
            } while (lVar14 != 0);
          }
          ON_SimpleArray<int>::Append(&local_118,(int *)local_138);
LAB_004eb769:
          lVar12 = lVar12 + 1;
        } while (lVar12 < (this->m_resFis).m_count);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uint)count);
  }
  if (bEqualFaceCheck) {
    ON_3dPointArray::ON_3dPointArray((ON_3dPointArray *)&local_b0,tcCount);
    bVar11 = 0 < local_160.m_count;
    if (local_160.m_count < 1) {
      uVar18 = 0xffffffff;
      uVar19 = 0x7fefffff;
    }
    else {
      local_11c = tcCount - 5;
      uVar16 = (ulong)(uint)tcCount;
      lVar12 = 0;
      local_188 = 1.79769313486232e+308;
      do {
        iVar7 = local_160.m_a[lVar12];
        local_100 = local_188;
        local_88 = lVar12;
        if (((long)iVar7 < 0) || (bVar5 = false, local_11c < 0xfffffffe)) {
LAB_004eb93a:
          bVar5 = false;
          local_188 = 1.79769313486232e+308;
        }
        else {
          this_00 = this->m_mesh;
          local_188 = 1.79769313486232e+308;
          if (iVar7 < (this_00->m_F).m_count) {
            local_80 = this->m_tc;
            this_01 = (this_00->m_F).m_a + iVar7;
            bVar5 = ON_MeshFace::IsQuad(this_01);
            local_98[0] = -1;
            local_98[1] = 0xffffffff;
            local_98[2] = 0xffffffff;
            local_98[3] = 0xffffffff;
            local_e8.m_min.z = 1.79769313486232e+308;
            local_e8.m_max.x = 1.79769313486232e+308;
            local_e8.m_min.x = 1.79769313486232e+308;
            local_e8.m_min.y = 1.79769313486232e+308;
            local_140 = (_func_int **)((ulong)bVar5 + 3);
            pp_Var13 = (_func_int **)0x0;
            do {
              ON_Mesh::Vertex((ON_3dPoint *)local_138,this_00,this_01->vi[(long)pp_Var13]);
              if (0 < tcCount) {
                uVar15 = 0;
                pOVar10 = local_f0;
                do {
                  dVar17 = ON_3dPoint::DistanceTo(pOVar10,(ON_3dPoint *)local_138);
                  if ((local_98[uVar15] == -1) || (dVar17 < (&local_e8.m_min.x)[uVar15])) {
                    local_98[uVar15] = this_01->vi[(long)pp_Var13];
                    (&local_e8.m_min.x)[uVar15] = dVar17;
                  }
                  uVar15 = uVar15 + 1;
                  pOVar10 = pOVar10 + 1;
                } while (uVar16 != uVar15);
              }
              this = local_148;
              pp_Var13 = (_func_int **)((long)pp_Var13 + 1);
            } while (pp_Var13 != local_140);
            if (tcCount < 1) {
              uVar18 = 0;
              uVar19 = 0;
            }
            else {
              dVar17 = 0.0;
              uVar15 = 0;
              do {
                if (local_98[uVar15] == -1) goto LAB_004eb93a;
                dVar3 = (&local_e8.m_min.x)[uVar15];
                uVar18 = SUB84(dVar3,0);
                uVar19 = (undefined4)((ulong)dVar3 >> 0x20);
                if (dVar3 <= dVar17) {
                  uVar18 = SUB84(dVar17,0);
                  uVar19 = (undefined4)((ulong)dVar17 >> 0x20);
                }
                uVar15 = uVar15 + 1;
                dVar17 = (double)CONCAT44(uVar19,uVar18);
              } while (uVar16 != uVar15);
            }
            bVar5 = (double)CONCAT44(uVar19,uVar18) < mappingTol ||
                    (double)CONCAT44(uVar19,uVar18) == mappingTol;
            local_188 = (double)CONCAT44(uVar19,uVar18);
            if ((0 < tcCount) &&
               ((double)CONCAT44(uVar19,uVar18) < mappingTol ||
                (double)CONCAT44(uVar19,uVar18) == mappingTol)) {
              uVar15 = 0;
              pOVar10 = pTcsOut;
              do {
                ON_3dPoint::ON_3dPoint
                          ((ON_3dPoint *)local_138,
                           (local_80->super_ON_SimpleArray<ON_2fPoint>).m_a + local_98[uVar15]);
                pOVar10->z = local_128;
                pOVar10->x = (double)local_138._0_8_;
                pOVar10->y = (double)local_138._8_8_;
                uVar15 = uVar15 + 1;
                pOVar10 = pOVar10 + 1;
              } while (uVar16 != uVar15);
              bVar5 = true;
            }
          }
        }
        bVar6 = true;
        if (bVar5) {
          if ((local_188 == 0.0) && (!NAN(local_188))) {
            bVar6 = false;
            goto LAB_004eb976;
          }
          if (local_100 <= local_188) goto LAB_004eb976;
          if (-1 < local_b0.m_capacity) {
            local_b0.m_count = 0;
          }
          ON_SimpleArray<ON_3dPoint>::Append(&local_b0,tcCount,pTcsOut);
        }
        else {
LAB_004eb976:
          local_188 = local_100;
        }
        uVar18 = SUB84(local_188,0);
        uVar19 = (undefined4)((ulong)local_188 >> 0x20);
        if (!bVar6) break;
        lVar12 = local_88 + 1;
        bVar11 = lVar12 < local_160.m_count;
      } while (lVar12 < local_160.m_count);
    }
    if (!bVar11) {
      if (mappingTol < (double)CONCAT44(uVar19,uVar18) ||
          mappingTol == (double)CONCAT44(uVar19,uVar18)) {
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_b0);
        goto LAB_004ebaed;
      }
      if (0 < tcCount) {
        lVar12 = 0;
        do {
          *(undefined8 *)((long)&pTcsOut->z + lVar12) =
               *(undefined8 *)((long)&(local_b0.m_a)->z + lVar12);
          puVar1 = (undefined8 *)((long)&(local_b0.m_a)->x + lVar12);
          uVar4 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pTcsOut->x + lVar12);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          lVar12 = lVar12 + 0x18;
        } while ((ulong)(uint)tcCount * 0x18 != lVar12);
      }
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_b0);
    bVar5 = true;
  }
  else {
LAB_004ebaed:
    if (local_160.m_count < 1) {
      local_138._0_8_ = mappingTol;
      if (0 < local_118.m_count) {
        lVar12 = 0;
        bVar5 = false;
        bVar11 = false;
        do {
          pTVar8 = TcSeamlessPatchCache::Get(patchCache,local_118.m_a[lVar12]);
          local_e8.m_min.x = (pTVar8->m_bbox).m_min.x;
          local_e8.m_min.y = (pTVar8->m_bbox).m_min.y;
          local_e8.m_min.z = (pTVar8->m_bbox).m_min.z;
          local_e8.m_max.x = (pTVar8->m_bbox).m_max.x;
          local_e8.m_max.y = (pTVar8->m_bbox).m_max.y;
          local_e8.m_max.z = (pTVar8->m_bbox).m_max.z;
          ON_3dVector::ON_3dVector
                    (&local_78,(double)local_138._0_8_,(double)local_138._0_8_,
                     (double)local_138._0_8_);
          delta.y = local_78.y;
          delta.x = local_78.x;
          delta.z = local_78.z;
          ON_BoundingBox::Expand(&local_e8,delta);
          bVar6 = ON_BoundingBox::Includes(&local_e8,&local_60,false);
          if (bVar6) {
            bVar6 = TcSeamlessPatch::Evaluate
                              (pTVar8,count,local_f8,(double *)local_138,tcCount,pTcsOut);
            bVar11 = bVar5;
            if (bVar6) {
              bVar5 = true;
              bVar11 = true;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < local_118.m_count);
        bVar5 = true;
        if (bVar11) goto LAB_004ebc94;
      }
    }
    else {
      local_e8.m_min.x = mappingTol;
      if (0 < local_160.m_count) {
        lVar12 = 0;
        bVar11 = false;
        do {
          pTVar8 = TcSeamlessPatchCache::Get(patchCache,local_160.m_a[lVar12]);
          bVar5 = TcSeamlessPatch::Evaluate
                            (pTVar8,count,local_f8,(double *)&local_e8,tcCount,pTcsOut);
          if (bVar5) {
            bVar11 = true;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < local_160.m_count);
        bVar5 = true;
        if (bVar11) goto LAB_004ebc94;
      }
    }
    bVar5 = false;
  }
LAB_004ebc94:
  ON_SimpleArray<int>::~ON_SimpleArray(&local_118);
  ON_SimpleArray<int>::~ON_SimpleArray(&local_160);
  return bVar5;
}

Assistant:

bool AdaptedMatchFaceTC(int count, const ON_3dPoint* pPts, SamplePoint* pSamplePts, int tcCount, ON_3dPoint* pTcsOut, double mappingTol, bool bEqualFaceCheck, TcSeamlessPatchCache& patchCache) const
	{
		// This code is dummy iteration through all faces to find a matching one
		//double minTol = DBL_MAX;
		//double matchTol = DBL_MAX;
		//int matchFi = -1;
		//for (int fi = 0; fi < m_mesh.m_F.Count(); fi++)
		//{
		//  double tol = 0.0;
		//  if (MatchFace(m_mesh, m_tc, fi, mappingTol, count, pPts, pTcsOut, tol))
		//  {
		//    if (tol < matchTol)
		//    {
		//      matchFi = fi;
		//      matchTol = tol;
		//    }
		//    //return true; // Uncomment this to return here
		//  }
		//  if (tol < minTol)
		//  {
		//    minTol = tol;
		//  }
		//}

		ON_BoundingBox samplePointBbox;
		ON_SimpleArray<int> commonFis;
		ON_SimpleArray<int> allFis;
		for (int fvi = 0; fvi < count; fvi++)
		{
			samplePointBbox.Set(pPts[fvi], 1);
			ON_RTreeSphere sphere;
			sphere.m_point[0] = pPts[fvi].x;
			sphere.m_point[1] = pPts[fvi].y;
			sphere.m_point[2] = pPts[fvi].z;
			sphere.m_radius = mappingTol;
			m_resFis.SetCount(0);
			m_pMeshFaceTree->Search(&sphere, RTreeCallback, (void*)this);
			if (fvi == 0)
			{
				commonFis = m_resFis;
			}
			else
			{
				ON_SimpleArray<int> newCommonFis(commonFis.Count());
				for (int i = 0; i < commonFis.Count(); i++)
				{
					if (m_resFis.Search(commonFis[i]) >= 0)
						newCommonFis.Append(commonFis[i]);
				}
				commonFis = newCommonFis;
			}
			for (int i = 0; i < m_resFis.Count(); i++)
				AddIfNotIncluded(allFis, m_resFis[i]);
		}

    if (bEqualFaceCheck)
    {
      double bestTol = DBL_MAX;
      ON_3dPointArray bestTcs(tcCount);
      for (int i = 0; i < commonFis.Count(); i++)
      {
        double tol = 0.0;
        if (MatchFace(m_mesh, m_tc, commonFis[i], mappingTol, tcCount, pPts, pTcsOut, tol))
        {
          if (tol == 0.0)
          {
            return true;
          }
          else if (tol < bestTol)
          {
            bestTcs.SetCount(0);
            bestTcs.Append(tcCount, pTcsOut);
            bestTol = tol;
          }
        }
      }
      if (bestTol < mappingTol)
      {
        for (int pi = 0; pi < tcCount; pi++)
        {
          pTcsOut[pi] = bestTcs[pi];
        }
        return true;
      }
    }

    if (commonFis.Count() > 0)
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < commonFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(commonFis[i]);
        if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
        {
          bSuccess = true;
        }
      }
      if (bSuccess)
        return true;
    }
    else
    {
      bool bSuccess = false;
      double maxDist = mappingTol;
      for (int i = 0; i < allFis.Count(); i++)
      {
        const TcSeamlessPatch& sp = patchCache.Get(allFis[i]);
        ON_BoundingBox patchMaxDistBb(sp.BBox());
        patchMaxDistBb.Expand(ON_3dVector(maxDist, maxDist, maxDist));
        if (patchMaxDistBb.Includes(samplePointBbox))
        {
          if (sp.Evaluate(count, pSamplePts, maxDist, tcCount, pTcsOut))
          {
            bSuccess = true;
          }
        }
      }
      if (bSuccess)
        return true;
    }


		return false;
	}